

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::checkEnd(duel *this)

{
  uint uVar1;
  uint *puVar2;
  ostream *poVar3;
  duel *this_local;
  
  puVar2 = field::getPile(&this->field1);
  uVar1 = *puVar2;
  puVar2 = field::getPile(&this->field2);
  if (*puVar2 < uVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Player 1 wins!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    player1Score = player1Score + 1;
  }
  else {
    puVar2 = field::getPile(&this->field2);
    uVar1 = *puVar2;
    puVar2 = field::getPile(&this->field1);
    if (*puVar2 < uVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Player 2 wins!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      player2Score = player2Score + 1;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Tie!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void duel::checkEnd() {
    if(field1.getPile() > field2.getPile()) {
        cout << "Player 1 wins!" << endl;
        player1Score++;
    }
    else if(field2.getPile() > field1.getPile()) {
        cout << "Player 2 wins!" << endl;
        player2Score++;
    }
    else cout << "Tie!" << endl;
}